

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O1

MP<6UL,_GF2::MOGrevlex<6UL>_> * __thiscall
GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>::SPoly(MP<6UL,_GF2::MOGrevlex<6UL>_> *this,size_t i)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  
  p_Var2 = (this->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>).
           super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var2 != (_List_node_base *)this) {
    do {
      psVar1 = (size_t *)((long)(p_Var2 + 1) + (i >> 6) * 8);
      *psVar1 = *psVar1 | 1L << ((byte)i & 0x3f);
      p_Var2 = (((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)&p_Var2->_M_next)->
               super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>)._M_impl._M_node.
               super__List_node_base._M_next;
    } while (p_Var2 != (_List_node_base *)this);
  }
  Normalize(this);
  return this;
}

Assistant:

MP& SPoly(size_t i)
	{
		for (iterator iter = begin(); iter != end(); ++iter)
			iter->Set(i, 1);
		Normalize();
		return *this;
	}